

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O3

parser_error parse_player_timed_effect_yx(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    if (*(long *)((long)pvVar3 + 8) == 0) {
      pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      wVar1 = parser_getint(p,"y");
      *(wchar_t *)(*(long *)((long)pvVar3 + 8) + 0x18) = wVar1;
      wVar1 = parser_getint(p,"x");
      *(wchar_t *)(*(long *)((long)pvVar3 + 8) + 0x1c) = wVar1;
      pVar2 = PARSE_ERROR_NONE;
    }
    return pVar2;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                ,0x1de,"enum parser_error parse_player_timed_effect_yx(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_effect_yx(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);

	assert(ps);
	if (!ps->e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	ps->e->y = parser_getint(p, "y");
	ps->e->x = parser_getint(p, "x");
	return PARSE_ERROR_NONE;
}